

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O0

JavascriptBigInt * Js::JavascriptBigInt::Mul(JavascriptBigInt *pbi1,JavascriptBigInt *pbi2)

{
  bool bVar1;
  ScriptContext *scriptContext;
  JavascriptBigInt *result;
  JavascriptBigInt *pbi2_local;
  JavascriptBigInt *pbi1_local;
  
  bVar1 = IsZero(pbi1);
  if ((bVar1) || (bVar1 = IsZero(pbi2), bVar1)) {
    scriptContext = RecyclableObject::GetScriptContext(&pbi1->super_RecyclableObject);
    pbi1_local = CreateZero(scriptContext);
  }
  else {
    pbi1_local = MulAbsolute(pbi1,pbi2);
    if ((pbi1->m_isNegative & 1U) != (pbi2->m_isNegative & 1U)) {
      pbi1_local->m_isNegative = true;
    }
  }
  return pbi1_local;
}

Assistant:

JavascriptBigInt * JavascriptBigInt::Mul(JavascriptBigInt * pbi1, JavascriptBigInt * pbi2)
    {
        if (JavascriptBigInt::IsZero(pbi1) || JavascriptBigInt::IsZero(pbi2))
        {
            return JavascriptBigInt::CreateZero(pbi1->GetScriptContext());
        }
        JavascriptBigInt * result = JavascriptBigInt::MulAbsolute(pbi1, pbi2);
        if (pbi1->m_isNegative != pbi2->m_isNegative) 
        {
            result->m_isNegative = true;
        }
        return result;
    }